

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtration_algorithms.h
# Opt level: O0

value_t max<float_const*>(float *values,int from,int to)

{
  float local_20;
  value_t next_value;
  int index;
  value_t max;
  int to_local;
  int from_local;
  float *values_local;
  
  max = 0.0;
  for (index = from; index <= to; index = index + 1) {
    local_20 = values[index];
    if ((index != 0) && (local_20 <= max)) {
      local_20 = max;
    }
    max = local_20;
  }
  return max;
}

Assistant:

inline value_t max(T values, int from, int to) {
	value_t max = 0;
	for (int index = from; index <= to; index++) {
		value_t next_value = values[index];
		max = index == 0 || next_value > max ? next_value : max;
	}

	return max;
}